

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

int Gia_ObjCheckEdge(Gia_Man_t *p,int iObj,int iNext)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = Vec_IntEntry(p->vEdge1,iObj);
  if (iVar1 == iNext) {
    uVar2 = 1;
  }
  else {
    iVar1 = Vec_IntEntry(p->vEdge2,iObj);
    uVar2 = (uint)(iVar1 == iNext);
  }
  return uVar2;
}

Assistant:

int Gia_ObjCheckEdge( Gia_Man_t * p, int iObj, int iNext )
{
    return Gia_ObjHaveEdge( p, iObj, iNext );
}